

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void wall_extends(level *lev,int x1,int y1,int x2,int y2)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int local_68;
  int local_64;
  int locale [3] [3];
  int bits;
  rm *loc;
  int local_28;
  int y;
  int x;
  uchar type;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  level *lev_local;
  
  if (((((-1 < x1) && (x2 < 0x50)) && (x1 <= x2)) && ((-1 < y1 && (y2 < 0x15)))) &&
     (local_28 = x1, y1 <= y2)) {
    for (; loc._4_4_ = y1, local_28 <= x2; local_28 = local_28 + 1) {
      for (; loc._4_4_ <= y2; loc._4_4_ = loc._4_4_ + 1) {
        bVar1 = lev->locations[local_28][loc._4_4_].typ;
        if (((bVar1 != 0) && (bVar1 < 0xd)) && (bVar1 != 0xc)) {
          bVar2 = iswall_or_stone(lev,local_28 + -1,loc._4_4_ + -1);
          local_68 = (int)bVar2;
          bVar2 = iswall_or_stone(lev,local_28,loc._4_4_ + -1);
          locale[0][1] = (int)bVar2;
          bVar2 = iswall_or_stone(lev,local_28 + 1,loc._4_4_ + -1);
          locale[1][1] = (int)bVar2;
          bVar2 = iswall_or_stone(lev,local_28 + -1,loc._4_4_);
          local_64 = (int)bVar2;
          bVar2 = iswall_or_stone(lev,local_28 + 1,loc._4_4_);
          locale[1][2] = (int)bVar2;
          bVar2 = iswall_or_stone(lev,local_28 + -1,loc._4_4_ + 1);
          locale[0][0] = (int)bVar2;
          bVar2 = iswall_or_stone(lev,local_28,loc._4_4_ + 1);
          locale[1][0] = (int)bVar2;
          bVar2 = iswall_or_stone(lev,local_28 + 1,loc._4_4_ + 1);
          locale[2][0] = (int)bVar2;
          bVar2 = iswall(lev,local_28,loc._4_4_ + -1);
          iVar3 = extend_spine((int (*) [3])&local_68,(int)bVar2,0,-1);
          bVar2 = iswall(lev,local_28,loc._4_4_ + 1);
          iVar4 = extend_spine((int (*) [3])&local_68,(int)bVar2,0,1);
          bVar2 = iswall(lev,local_28 + 1,loc._4_4_);
          iVar5 = extend_spine((int (*) [3])&local_68,(int)bVar2,1,0);
          bVar2 = iswall(lev,local_28 + -1,loc._4_4_);
          uVar6 = extend_spine((int (*) [3])&local_68,(int)bVar2,-1,0);
          uVar6 = iVar3 << 3 | iVar4 << 2 | iVar5 << 1 | uVar6;
          if (uVar6 != 0) {
            lev->locations[local_28][loc._4_4_].typ =
                 "\x01\x02\x02\x02\x01\x04\x03\t\x01\x06\x05\b\x01\n\v\a"[(int)uVar6];
          }
        }
      }
    }
    return;
  }
  panic("wall_extends: bad bounds (%d,%d) to (%d,%d)",(ulong)(uint)x1,(ulong)(uint)y1,
        (ulong)(uint)x2,(ulong)(uint)y2);
}

Assistant:

void wall_extends(struct level *lev, int x1, int y1, int x2, int y2)
{
	uchar type;
	int x, y;
	struct rm *loc;
	int bits;
	int locale[3][3];	/* rock or wall status surrounding positions */
	/*
	 * Value 0 represents a free-standing wall.  It could be anything,
	 * so even though this table says VWALL, we actually leave whatever
	 * typ was there alone.
	 */
	static const xchar spine_array[16] = {
	    VWALL,	HWALL,		HWALL,		HWALL,
	    VWALL,	TRCORNER,	TLCORNER,	TDWALL,
	    VWALL,	BRCORNER,	BLCORNER,	TUWALL,
	    VWALL,	TLWALL,		TRWALL,		CROSSWALL
	};

	/* sanity check on incoming variables */
	if (x1 < 0 || x2 >= COLNO || x1 > x2 || y1 < 0 || y2 >= ROWNO || y1 > y2)
	    panic("wall_extends: bad bounds (%d,%d) to (%d,%d)", x1, y1, x2, y2);

	for (x = x1; x <= x2; x++)
	    for (y = y1; y <= y2; y++) {
		loc = &lev->locations[x][y];
		type = loc->typ;
		if ( !(IS_WALL(type) && type != DBWALL)) continue;

		/* set the locations TRUE if rock or wall or out of bounds */
		locale[0][0] = iswall_or_stone(lev, x-1, y-1);
		locale[1][0] = iswall_or_stone(lev,   x, y-1);
		locale[2][0] = iswall_or_stone(lev, x+1, y-1);

		locale[0][1] = iswall_or_stone(lev, x-1,   y);
		locale[2][1] = iswall_or_stone(lev, x+1,   y);

		locale[0][2] = iswall_or_stone(lev, x-1, y+1);
		locale[1][2] = iswall_or_stone(lev,   x, y+1);
		locale[2][2] = iswall_or_stone(lev, x+1, y+1);

		/* determine if wall should extend to each direction NSEW */
		bits =    (extend_spine(locale, iswall(lev, x,y-1),  0, -1) << 3)
			| (extend_spine(locale, iswall(lev, x,y+1),  0,  1) << 2)
			| (extend_spine(locale, iswall(lev, x+1,y),  1,  0) << 1)
			|  extend_spine(locale, iswall(lev, x-1,y), -1,  0);

		/* don't change typ if wall is free-standing */
		if (bits) loc->typ = spine_array[bits];
	    }
}